

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.cc
# Opt level: O0

int memReadStat(int field)

{
  int iVar1;
  FILE *__stream;
  int in_EDI;
  FILE *in;
  int value;
  pid_t pid;
  char name [256];
  int local_110;
  uint local_10c;
  char local_108 [256];
  int local_8;
  int local_4;
  
  local_8 = in_EDI;
  local_10c = getpid();
  sprintf(local_108,"/proc/%d/statm",(ulong)local_10c);
  __stream = fopen(local_108,"rb");
  if (__stream == (FILE *)0x0) {
    local_4 = 0;
  }
  else {
    for (; -1 < local_8; local_8 = local_8 + -1) {
      iVar1 = __isoc99_fscanf(__stream,"%d",&local_110);
      if (iVar1 != 1) {
        printf("ERROR! Failed to parse memory statistics from \"/proc\".\n");
        exit(1);
      }
    }
    fclose(__stream);
    local_4 = local_110;
  }
  return local_4;
}

Assistant:

static inline int memReadStat(int field)
{
    char name[256];
    pid_t pid = getpid();
    int value;

    sprintf(name, "/proc/%d/statm", pid);
    FILE *in = fopen(name, "rb");
    if (in == NULL) return 0;

    for (; field >= 0; field--)
        if (fscanf(in, "%d", &value) != 1)
            printf("ERROR! Failed to parse memory statistics from \"/proc\".\n"), exit(1);
    fclose(in);
    return value;
}